

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

bool __thiscall
QApplicationPrivate::notify_helper(QApplicationPrivate *this,QObject *receiver,QEvent *e)

{
  long lVar1;
  char cVar2;
  undefined1 uVar3;
  long lVar4;
  QWidget *pQVar5;
  QWidget *pQVar6;
  bool on;
  QWidget *widget;
  
  if (((*(char *)(*(long *)(*(long *)(receiver + 8) + 0x58) + 0x8f) == '\x01') &&
      (lVar1 = *(long *)(*(long *)(*(long *)(receiver + 8) + 0x58) + 0x50),
      lVar4 = QCoreApplicationPrivate::mainThread(), lVar4 == lVar1)) &&
     (cVar2 = QCoreApplicationPrivate::sendThroughApplicationEventFilters
                        ((QObject *)this,(QEvent *)receiver), cVar2 != '\0')) {
    return true;
  }
  if ((*(byte *)(*(long *)(receiver + 8) + 0x30) & 1) == 0) goto LAB_002bd9b5;
  if ((*(short *)(e + 8) == 0x3c) || (*(short *)(e + 8) == 10)) {
    pQVar5 = QApplication::activePopupWidget();
    on = true;
    if (pQVar5 != (QWidget *)0x0) {
      pQVar5 = QApplication::activePopupWidget();
      pQVar6 = QWidget::window((QWidget *)receiver);
      if (pQVar5 != pQVar6) goto LAB_002bd97c;
    }
LAB_002bd98c:
    QWidget::setAttribute((QWidget *)receiver,WA_UnderMouse,on);
  }
  else {
LAB_002bd97c:
    on = false;
    if ((*(short *)(e + 8) == 0x3e) || (*(short *)(e + 8) == 0xb)) goto LAB_002bd98c;
  }
  if (*(QLayout **)(*(long *)(receiver + 8) + 0x98) != (QLayout *)0x0) {
    QLayout::widgetEvent(*(QLayout **)(*(long *)(receiver + 8) + 0x98),e);
  }
LAB_002bd9b5:
  cVar2 = QCoreApplicationPrivate::sendThroughObjectEventFilters(receiver,e);
  if (cVar2 != '\0') {
    return true;
  }
  uVar3 = (**(code **)(*(long *)receiver + 0x28))(receiver,e);
  e[0xb] = (QEvent)0x0;
  return (bool)uVar3;
}

Assistant:

bool QApplicationPrivate::notify_helper(QObject *receiver, QEvent * e)
{
    // These tracepoints (and the whole function, actually) are very similar
    // to the ones in QCoreApplicationPrivate::notify_helper; the reason for their
    // duplication is because tracepoint symbols are not exported by QtCore.
    // If you adjust the tracepoints here, consider adjusting QCoreApplicationPrivate too.
    Q_TRACE(QApplication_notify_entry, receiver, e, e->type());
    bool consumed = false;
    bool filtered = false;
    Q_TRACE_EXIT(QApplication_notify_exit, consumed, filtered);

    // send to all application event filters
    QThreadData *threadData = receiver->d_func()->threadData.loadRelaxed();
    if (threadData->requiresCoreApplication
        && threadData->thread.loadAcquire() == mainThread()
        && sendThroughApplicationEventFilters(receiver, e)) {
        filtered = true;
        return filtered;
    }

    if (receiver->isWidgetType()) {
        QWidget *widget = static_cast<QWidget *>(receiver);

#if !defined(QT_NO_CURSOR)
        // toggle HasMouse widget state on enter and leave
        if ((e->type() == QEvent::Enter || e->type() == QEvent::DragEnter) &&
            (!QApplication::activePopupWidget() || QApplication::activePopupWidget() == widget->window()))
            widget->setAttribute(Qt::WA_UnderMouse, true);
        else if (e->type() == QEvent::Leave || e->type() == QEvent::DragLeave)
            widget->setAttribute(Qt::WA_UnderMouse, false);
#endif

        if (QLayout *layout=widget->d_func()->layout) {
            layout->widgetEvent(e);
        }
    }

    // send to all receiver event filters
    if (sendThroughObjectEventFilters(receiver, e)) {
        filtered = true;
        return filtered;
    }

    // deliver the event
    consumed = receiver->event(e);

    QCoreApplicationPrivate::setEventSpontaneous(e, false);
    return consumed;
}